

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederate.cpp
# Opt level: O1

Publication * __thiscall
helics::ValueFederate::getPublication(ValueFederate *this,string_view name,int index1)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ValueFederateManager *this_00;
  size_type *psVar3;
  size_type sVar4;
  uint uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  Publication *pPVar7;
  uint uVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  ulong uVar10;
  uint __val;
  undefined8 uVar11;
  uint __len;
  string_view key;
  string __str;
  size_type *local_b0;
  size_type local_a0;
  undefined8 uStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = (this->vfManager)._M_t.
            super___uniq_ptr_impl<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_helics::ValueFederateManager_*,_std::default_delete<helics::ValueFederateManager>_>
            .super__Head_base<0UL,_helics::ValueFederateManager_*,_false>._M_head_impl;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,name._M_str,name._M_str + name._M_len);
  pbVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_replace_aux(&local_50,local_50._M_string_length,0,1,'_');
  paVar2 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
  paVar9 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p == paVar9) {
    local_70.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_70.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    local_70._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_70.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
  }
  local_70._M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  __val = -index1;
  if (0 < index1) {
    __val = index1;
  }
  __len = 1;
  if (9 < __val) {
    uVar10 = (ulong)__val;
    uVar5 = 4;
    do {
      __len = uVar5;
      uVar8 = (uint)uVar10;
      if (uVar8 < 100) {
        __len = __len - 2;
        goto LAB_001f9907;
      }
      if (uVar8 < 1000) {
        __len = __len - 1;
        goto LAB_001f9907;
      }
      if (uVar8 < 10000) goto LAB_001f9907;
      uVar10 = uVar10 / 10000;
      uVar5 = __len + 4;
    } while (99999 < uVar8);
    __len = __len + 1;
  }
LAB_001f9907:
  paVar9 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar9;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_90,(ulong)(__len + -(index1 >> 0x1f)),'-');
  CLI::std::__detail::__to_chars_10_impl<unsigned_int>
            (local_90._M_dataplus._M_p + (uint)-(index1 >> 0x1f),__len,__val);
  uVar11 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    uVar11 = local_70.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar11 < local_90._M_string_length + local_70._M_string_length) {
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar9) {
      uVar11 = local_90.field_2._M_allocated_capacity;
    }
    if (local_90._M_string_length + local_70._M_string_length <= (ulong)uVar11) {
      pbVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::replace(&local_90,0,0,local_70._M_dataplus._M_p,local_70._M_string_length);
      goto LAB_001f9996;
    }
  }
  pbVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_70,local_90._M_dataplus._M_p,local_90._M_string_length);
LAB_001f9996:
  local_b0 = &local_a0;
  psVar3 = (size_type *)(pbVar6->_M_dataplus)._M_p;
  paVar1 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar3 == paVar1) {
    local_a0 = paVar1->_M_allocated_capacity;
    uStack_98 = *(undefined8 *)((long)&pbVar6->field_2 + 8);
  }
  else {
    local_a0 = paVar1->_M_allocated_capacity;
    local_b0 = psVar3;
  }
  sVar4 = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar6->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  key._M_str = (char *)local_b0;
  key._M_len = sVar4;
  pPVar7 = ValueFederateManager::getPublication(this_00,key);
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar9) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return pPVar7;
}

Assistant:

const Publication& ValueFederate::getPublication(std::string_view name, int index1) const
{
    return vfManager->getPublication(std::string(name) + '_' + std::to_string(index1));
}